

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O1

void __thiscall
btRotationalLimitMotor2::testLimitValue(btRotationalLimitMotor2 *this,btScalar test_value)

{
  float fVar1;
  float fVar2;
  
  fVar1 = this->m_loLimit;
  fVar2 = this->m_hiLimit;
  if (fVar2 < fVar1) {
    this->m_currentLimit = 0;
    this->m_currentLimitError = 0.0;
    return;
  }
  this->m_currentLimitError = test_value - fVar1;
  if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
    this->m_currentLimit = 3;
    return;
  }
  this->m_currentLimitErrorHi = test_value - fVar2;
  this->m_currentLimit = 4;
  return;
}

Assistant:

void btRotationalLimitMotor2::testLimitValue(btScalar test_value)
{
	//we can't normalize the angles here because we would lost the sign that we use later, but it doesn't seem to be a problem
	if(m_loLimit > m_hiLimit) {
		m_currentLimit = 0;
		m_currentLimitError = btScalar(0.f);
	}
	else if(m_loLimit == m_hiLimit) {
		m_currentLimitError = test_value - m_loLimit;
		m_currentLimit = 3;
	} else {
		m_currentLimitError = test_value - m_loLimit;
		m_currentLimitErrorHi = test_value - m_hiLimit;
		m_currentLimit = 4;
	}
}